

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_spatializer_process_pcm_frames
                    (ma_spatializer *pSpatializer,ma_spatializer_listener *pListener,
                    void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  byte bVar5;
  ma_uint32 channelsIn;
  ma_attenuation_model mVar6;
  ma_handedness mVar7;
  undefined8 uVar8;
  ma_uint64 frameCount_00;
  float *pfVar9;
  ulong uVar10;
  long lVar11;
  ma_channel *pChannelMapIn;
  size_t sVar12;
  void *__s;
  double dVar13;
  double dVar14;
  int iVar16;
  undefined1 auVar15 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  long lVar25;
  long lVar26;
  undefined1 auVar27 [16];
  int iVar28;
  undefined8 uVar29;
  float fVar30;
  float fVar31;
  ma_vec3f relativePos;
  ma_vec3f relativeDir;
  ma_channel_mix_mode in_stack_fffffffffffffed0;
  ma_mono_expansion_mode in_stack_fffffffffffffed8;
  ma_channel *pChannelMapOut;
  ma_vec3f local_118;
  float local_10c;
  undefined1 local_108 [16];
  ulong local_f0;
  float local_e4;
  float local_e0;
  ma_uint32 local_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  ma_channel *local_c8;
  float local_c0;
  ma_channel *local_b8;
  undefined8 uStack_b0;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  ma_uint64 local_90;
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pChannelMapIn = pSpatializer->pChannelMapIn;
  pChannelMapOut = (pListener->config).pChannelMapOut;
  if (pSpatializer->attenuationModel == ma_attenuation_model_none) {
    if (pListener->isEnabled == 0) {
      for (uVar10 = (pSpatializer->channelsOut << 2) * frameCount; uVar10 != 0;
          uVar10 = uVar10 - sVar12) {
        sVar12 = 0xffffffff;
        if (uVar10 < 0xffffffff) {
          sVar12 = uVar10;
        }
        memset(pFramesOut,0,sVar12);
        pFramesOut = (void *)((long)pFramesOut + sVar12);
      }
    }
    else {
      channelsIn = pSpatializer->channelsIn;
      if (channelsIn == pSpatializer->channelsOut) {
        if (pFramesOut != pFramesIn) {
          for (uVar10 = (channelsIn << 2) * frameCount; uVar10 != 0; uVar10 = uVar10 - sVar12) {
            sVar12 = 0xffffffff;
            if (uVar10 < 0xffffffff) {
              sVar12 = uVar10;
            }
            memcpy(pFramesOut,pFramesIn,sVar12);
            pFramesOut = (void *)((long)pFramesOut + sVar12);
            pFramesIn = (void *)((long)pFramesIn + sVar12);
          }
        }
      }
      else {
        ma_channel_map_apply_f32
                  ((float *)pFramesOut,pChannelMapOut,pSpatializer->channelsOut,(float *)pFramesIn,
                   pChannelMapIn,channelsIn,frameCount,in_stack_fffffffffffffed0,
                   in_stack_fffffffffffffed8);
      }
    }
    pSpatializer->dopplerPitch = 1.0;
    return MA_SUCCESS;
  }
  local_dc = pSpatializer->channelsIn;
  local_f0 = (ulong)pSpatializer->channelsOut;
  fVar31 = pSpatializer->minDistance;
  local_48 = ZEXT416((uint)pSpatializer->dopplerFactor);
  local_78._0_4_ = (pListener->velocity).x;
  local_78._4_4_ = (pListener->velocity).y;
  uStack_70 = 0;
  local_68 = ZEXT416((uint)(pListener->velocity).z);
  local_58 = ZEXT416((uint)(pListener->config).speedOfSound);
  if (pSpatializer->positioning == ma_positioning_relative) {
    local_118.z = (pSpatializer->position).z;
    local_118.x = (pSpatializer->position).x;
    local_118.y = (pSpatializer->position).y;
    local_c8 = *(ma_channel **)&pSpatializer->direction;
    local_c0 = (pSpatializer->direction).z;
    fVar18 = pSpatializer->rolloff;
    fVar19 = pSpatializer->maxDistance;
  }
  else {
    local_108 = ZEXT416((uint)pSpatializer->rolloff);
    local_d8 = pSpatializer->maxDistance;
    ma_spatializer_get_relative_position_and_direction
              (pSpatializer,pListener,&local_118,(ma_vec3f *)&local_c8);
    fVar18 = (float)local_108._0_4_;
    fVar19 = local_d8;
  }
  fVar21 = SQRT(local_118.z * local_118.z + local_118.x * local_118.x + local_118.y * local_118.y);
  mVar6 = pSpatializer->attenuationModel;
  fVar30 = 1.0;
  if (mVar6 == ma_attenuation_model_exponential) {
    if (fVar31 < fVar19) {
      fVar30 = fVar21;
      if (fVar19 <= fVar21) {
        fVar30 = fVar19;
      }
      fVar19 = fVar31;
      if (fVar31 <= fVar30) {
        fVar19 = fVar30;
      }
      dVar13 = pow((double)(fVar19 / fVar31),(double)-fVar18);
      fVar30 = (float)dVar13;
    }
  }
  else if (mVar6 == ma_attenuation_model_linear) {
    if (fVar31 < fVar19) {
      fVar30 = fVar21;
      if (fVar19 <= fVar21) {
        fVar30 = fVar19;
      }
      fVar17 = fVar31;
      if (fVar31 <= fVar30) {
        fVar17 = fVar30;
      }
      fVar30 = 1.0 - ((fVar17 - fVar31) * fVar18) / (fVar19 - fVar31);
    }
  }
  else if ((mVar6 == ma_attenuation_model_inverse) && (fVar31 < fVar19)) {
    fVar30 = fVar21;
    if (fVar19 <= fVar21) {
      fVar30 = fVar19;
    }
    fVar19 = fVar31;
    if (fVar31 <= fVar30) {
      fVar19 = fVar30;
    }
    fVar30 = fVar31 / (fVar18 * (fVar19 - fVar31) + fVar31);
  }
  fVar31 = 0.0;
  if (0.001 < fVar21) {
    local_d8 = 1.0 / fVar21;
    local_e0 = local_118.z * local_d8;
    fStack_d4 = local_118.y;
    fVar18 = local_d8 * local_118.x;
    local_88 = ZEXT416((uint)fVar18);
    local_d8 = fStack_d4 * local_d8;
    fVar31 = fVar21;
    fStack_d0 = fStack_d4;
    fStack_cc = fStack_d4;
    fVar19 = 1.0;
    if (pSpatializer->coneInnerAngleInRadians < 6.283185) {
      local_b8 = local_c8;
      uStack_b0 = 0;
      local_a8 = -fVar18;
      uStack_a4 = 0x80000000;
      uStack_a0 = 0x80000000;
      uStack_9c = 0x80000000;
      fVar18 = local_c0 * local_e0;
      local_108._0_4_ = fVar30;
      local_10c = pSpatializer->coneOuterGain;
      local_e4 = pSpatializer->coneOuterAngleInRadians;
      dVar13 = sin(1.5707963267948966 - (double)(pSpatializer->coneInnerAngleInRadians * 0.5));
      dVar14 = sin(1.5707963267948966 - (double)(local_e4 * 0.5));
      fVar18 = (local_a8 * SUB84(local_b8,0) - (float)((ulong)local_b8 >> 0x20) * local_d8) - fVar18
      ;
      fVar30 = (float)local_108._0_4_;
      fVar31 = fVar21;
      fVar19 = 1.0;
      if ((fVar18 <= (float)dVar13) && (fVar21 = (float)dVar14, fVar19 = local_10c, fVar21 < fVar18)
         ) {
        fVar19 = (fVar18 - fVar21) / ((float)dVar13 - fVar21);
        fVar19 = local_10c * (1.0 - fVar19) + fVar19;
      }
    }
    fVar30 = fVar30 * fVar19;
    fVar19 = (pListener->config).coneInnerAngleInRadians;
    fVar21 = fVar31;
    if (fVar19 < 6.283185) {
      local_108._0_4_ = fVar30;
      mVar7 = (pListener->config).handedness;
      fVar30 = (pListener->config).coneOuterGain;
      fVar18 = (pListener->config).coneOuterAngleInRadians;
      local_b8 = pChannelMapIn;
      dVar13 = sin(1.5707963267948966 - (double)(fVar19 * 0.5));
      local_a8 = (float)dVar13;
      dVar13 = sin(1.5707963267948966 - (double)(fVar18 * 0.5));
      fVar19 = local_e0 * *(float *)(&DAT_001bf460 + (ulong)(mVar7 == ma_handedness_right) * 4) +
               (float)local_88._0_4_ * 0.0 + local_d8 * 0.0;
      if (fVar19 <= local_a8) {
        fVar18 = (float)dVar13;
        if (fVar18 < fVar19) {
          fVar19 = (fVar19 - fVar18) / (local_a8 - fVar18);
          fVar30 = fVar30 * (1.0 - fVar19) + fVar19;
        }
      }
      else {
        fVar30 = 1.0;
      }
      fVar30 = (float)local_108._0_4_ * fVar30;
      pChannelMapIn = local_b8;
      fVar21 = fVar31;
    }
  }
  auVar23 = _DAT_001be2d0;
  auVar24 = _DAT_001b3600;
  pfVar9 = &pSpatializer->maxGain;
  fVar19 = fVar30;
  if (pSpatializer->maxGain <= fVar30) {
    fVar19 = *pfVar9;
  }
  if (pSpatializer->minGain <= fVar19) {
    if (fVar30 < *pfVar9) goto LAB_0019f371;
  }
  else {
    pfVar9 = &pSpatializer->minGain;
  }
  fVar30 = *pfVar9;
LAB_0019f371:
  if (pChannelMapOut == (ma_channel *)0x0) {
    __assert_fail("pChannelMapOut != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x9414,
                  "ma_result ma_spatializer_process_pcm_frames(ma_spatializer *, ma_spatializer_listener *, void *, const void *, ma_uint64)"
                 );
  }
  if (local_f0 != 0) {
    pfVar9 = pSpatializer->pNewChannelGainsOut;
    lVar11 = local_f0 - 1;
    auVar15._8_4_ = (int)lVar11;
    auVar15._0_8_ = lVar11;
    auVar15._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar10 = 0;
    auVar15 = auVar15 ^ _DAT_001b3600;
    auVar20 = _DAT_001b35d0;
    auVar22 = _DAT_001b35e0;
    do {
      auVar27 = auVar22 ^ auVar24;
      iVar16 = auVar15._4_4_;
      if ((bool)(~(auVar27._4_4_ == iVar16 && auVar15._0_4_ < auVar27._0_4_ ||
                  iVar16 < auVar27._4_4_) & 1)) {
        *(float *)((long)pfVar9 + uVar10) = fVar30;
      }
      if ((auVar27._12_4_ != auVar15._12_4_ || auVar27._8_4_ <= auVar15._8_4_) &&
          auVar27._12_4_ <= auVar15._12_4_) {
        *(float *)((long)pfVar9 + uVar10 + 4) = fVar30;
      }
      auVar27 = auVar20 ^ auVar24;
      iVar28 = auVar27._4_4_;
      if (iVar28 <= iVar16 && (iVar28 != iVar16 || auVar27._0_4_ <= auVar15._0_4_)) {
        *(float *)((long)pfVar9 + uVar10 + 8) = fVar30;
        *(float *)((long)pfVar9 + uVar10 + 0xc) = fVar30;
      }
      lVar11 = auVar22._8_8_;
      lVar25 = auVar23._0_8_;
      auVar22._0_8_ = auVar22._0_8_ + lVar25;
      lVar26 = auVar23._8_8_;
      auVar22._8_8_ = lVar11 + lVar26;
      lVar11 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + lVar25;
      auVar20._8_8_ = lVar11 + lVar26;
      uVar10 = uVar10 + 0x10;
    } while ((local_f0 * 4 + 0xc & 0xfffffffffffffff0) != uVar10);
  }
  local_108._0_8_ = pListener;
  local_d8 = fVar31;
  local_90 = frameCount;
  if (pListener->isEnabled == 0) {
    __s = pFramesOut;
    for (uVar10 = (pSpatializer->channelsOut << 2) * frameCount; uVar10 != 0;
        uVar10 = uVar10 - sVar12) {
      sVar12 = 0xffffffff;
      if (uVar10 < 0xffffffff) {
        sVar12 = uVar10;
      }
      memset(__s,0,sVar12);
      __s = (void *)((long)__s + sVar12);
    }
  }
  else {
    ma_channel_map_apply_f32
              ((float *)pFramesOut,pChannelMapOut,(ma_uint32)local_f0,(float *)pFramesIn,
               pChannelMapIn,local_dc,frameCount,(ma_channel_mix_mode)fVar21,
               (ma_mono_expansion_mode)pChannelMapOut);
  }
  frameCount_00 = local_90;
  uVar8 = local_108._0_8_;
  if ((0.001 < fVar21) && (local_f0 != 0)) {
    fVar31 = 1.0 / local_d8;
    uVar10 = 0;
    do {
      bVar5 = pChannelMapOut[uVar10];
      if (((5 < bVar5) || (fVar19 = 1.0, (0x23U >> (bVar5 & 0x1f) & 1) == 0)) &&
         (fVar19 = 1.0, 0x1f < (byte)(bVar5 - 0x14))) {
        lVar11 = 0;
        do {
          fVar19 = *(float *)((long)g_maChannelPlaneRatios[0] +
                             (ulong)((uint)bVar5 * 8) * 3 + lVar11 * 4);
          if ((fVar19 != 0.0) || (NAN(fVar19))) {
            uVar29 = 0;
            fVar19 = -1.0;
            if (bVar5 < 0x34) {
              uVar29._0_4_ = g_maChannelDirections[bVar5].x;
              uVar29._4_4_ = g_maChannelDirections[bVar5].y;
              fVar19 = g_maChannelDirections[bVar5].z;
            }
            fVar19 = (((float)((ulong)uVar29 >> 0x20) * local_118.y * fVar31 +
                       fVar31 * local_118.x * (float)uVar29 + fVar19 * fVar31 * local_118.z + -1.0)
                      * pSpatializer->directionalAttenuationFactor + 1.0 + 1.0) * 0.5;
            goto LAB_0019f5a3;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 6);
        fVar19 = 1.0;
      }
LAB_0019f5a3:
      if (fVar19 <= 0.2) {
        fVar19 = 0.2;
      }
      pSpatializer->pNewChannelGainsOut[uVar10] = fVar19 * pSpatializer->pNewChannelGainsOut[uVar10]
      ;
      uVar10 = uVar10 + 1;
    } while (uVar10 != local_f0);
  }
  ma_gainer_set_gains(&pSpatializer->gainer,pSpatializer->pNewChannelGainsOut);
  ma_gainer_process_pcm_frames(&pSpatializer->gainer,pFramesOut,pFramesOut,frameCount_00);
  fVar31 = 1.0;
  if (0.0 < (float)local_48._0_4_) {
    uVar29 = *(undefined8 *)(uVar8 + 0x30);
    uVar1 = (pSpatializer->position).x;
    uVar3 = (pSpatializer->position).y;
    fVar18 = (float)uVar29 - (float)uVar1;
    fVar30 = (float)((ulong)uVar29 >> 0x20) - (float)uVar3;
    fVar19 = *(float *)(uVar8 + 0x38) - (pSpatializer->position).z;
    auVar24._0_4_ = SQRT(fVar19 * fVar19 + fVar18 * fVar18 + fVar30 * fVar30);
    if ((auVar24._0_4_ != 0.0) || (NAN(auVar24._0_4_))) {
      uVar2 = (pSpatializer->velocity).x;
      uVar4 = (pSpatializer->velocity).y;
      auVar27._0_4_ = (float)local_58._0_4_ / (float)local_48._0_4_;
      auVar23._0_4_ =
           (float)local_68._0_4_ * fVar19 + (float)local_78 * fVar18 + local_78._4_4_ * fVar30;
      auVar23._4_4_ =
           (pSpatializer->velocity).z * fVar19 + (float)uVar2 * fVar18 + (float)uVar4 * fVar30;
      auVar23._8_4_ =
           (float)local_68._4_4_ * fVar19 + local_78._4_4_ * fVar18 + (float)uStack_70 * fVar30;
      auVar23._12_4_ = fVar19 * 0.0 + (float)uVar4 * fVar18 + uStack_70._4_4_ * fVar30;
      auVar24._4_4_ = auVar24._0_4_;
      auVar24._8_4_ = auVar24._0_4_;
      auVar24._12_4_ = auVar24._0_4_;
      auVar24 = divps(auVar23,auVar24);
      auVar27._4_4_ = auVar27._0_4_;
      auVar27._8_4_ = auVar27._0_4_;
      auVar27._12_4_ = auVar27._0_4_;
      auVar24 = minps(auVar24,auVar27);
      fVar31 = ((float)local_58._0_4_ - (float)local_48._0_4_ * auVar24._0_4_) /
               ((float)local_58._0_4_ - (float)local_48._0_4_ * auVar24._4_4_);
    }
  }
  pSpatializer->dopplerPitch = fVar31;
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_spatializer_process_pcm_frames(ma_spatializer* pSpatializer, ma_spatializer_listener* pListener, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_channel* pChannelMapIn  = pSpatializer->pChannelMapIn;
    ma_channel* pChannelMapOut = pListener->config.pChannelMapOut;

    if (pSpatializer == NULL) {
        return MA_INVALID_ARGS;
    }

    /* If we're not spatializing we need to run an optimized path. */
    if (c89atomic_load_i32(&pSpatializer->attenuationModel) == ma_attenuation_model_none) {
        if (ma_spatializer_listener_is_enabled(pListener)) {
            /* No attenuation is required, but we'll need to do some channel conversion. */
            if (pSpatializer->channelsIn == pSpatializer->channelsOut) {
                ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, ma_format_f32, pSpatializer->channelsIn);
            } else {
                ma_channel_map_apply_f32((float*)pFramesOut, pChannelMapOut, pSpatializer->channelsOut, (const float*)pFramesIn, pChannelMapIn, pSpatializer->channelsIn, frameCount, ma_channel_mix_mode_rectangular, ma_mono_expansion_mode_default);   /* Safe casts to float* because f32 is the only supported format. */
            }
        } else {
            /* The listener is disabled. Output silence. */
            ma_silence_pcm_frames(pFramesOut, frameCount, ma_format_f32, pSpatializer->channelsOut);
        }

        /*
        We're not doing attenuation so don't bother with doppler for now. I'm not sure if this is
        the correct thinking so might need to review this later.
        */
        pSpatializer->dopplerPitch = 1;
    } else {
        /*
        Let's first determine which listener the sound is closest to. Need to keep in mind that we
        might not have a world or any listeners, in which case we just spatializer based on the
        listener being positioned at the origin (0, 0, 0).
        */
        ma_vec3f relativePosNormalized;
        ma_vec3f relativePos;   /* The position relative to the listener. */
        ma_vec3f relativeDir;   /* The direction of the sound, relative to the listener. */
        ma_vec3f listenerVel;   /* The volocity of the listener. For doppler pitch calculation. */
        float speedOfSound;
        float distance = 0;
        float gain = 1;
        ma_uint32 iChannel;
        const ma_uint32 channelsOut = pSpatializer->channelsOut;
        const ma_uint32 channelsIn  = pSpatializer->channelsIn;
        float minDistance = ma_spatializer_get_min_distance(pSpatializer);
        float maxDistance = ma_spatializer_get_max_distance(pSpatializer);
        float rolloff = ma_spatializer_get_rolloff(pSpatializer);
        float dopplerFactor = ma_spatializer_get_doppler_factor(pSpatializer);

        /*
        We'll need the listener velocity for doppler pitch calculations. The speed of sound is
        defined by the listener, so we'll grab that here too.
        */
        if (pListener != NULL) {
            listenerVel  = pListener->velocity;
            speedOfSound = pListener->config.speedOfSound;
        } else {
            listenerVel  = ma_vec3f_init_3f(0, 0, 0);
            speedOfSound = MA_DEFAULT_SPEED_OF_SOUND;
        }

        if (pListener == NULL || ma_spatializer_get_positioning(pSpatializer) == ma_positioning_relative) {
            /* There's no listener or we're using relative positioning. */
            relativePos = pSpatializer->position;
            relativeDir = pSpatializer->direction;
        } else {
            /*
            We've found a listener and we're using absolute positioning. We need to transform the
            sound's position and direction so that it's relative to listener. Later on we'll use
            this for determining the factors to apply to each channel to apply the panning effect.
            */
            ma_spatializer_get_relative_position_and_direction(pSpatializer, pListener, &relativePos, &relativeDir);
        }

        distance = ma_vec3f_len(relativePos);

        /* We've gathered the data, so now we can apply some spatialization. */
        switch (ma_spatializer_get_attenuation_model(pSpatializer)) {
            case ma_attenuation_model_inverse:
            {
                gain = ma_attenuation_inverse(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_linear:
            {
                gain = ma_attenuation_linear(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_exponential:
            {
                gain = ma_attenuation_exponential(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_none:
            default:
            {
                gain = 1;
            } break;
        }

        /* Normalize the position. */
        if (distance > 0.001f) {
            float distanceInv = 1/distance;
            relativePosNormalized    = relativePos;
            relativePosNormalized.x *= distanceInv;
            relativePosNormalized.y *= distanceInv;
            relativePosNormalized.z *= distanceInv;
        } else {
            distance = 0;
            relativePosNormalized = ma_vec3f_init_3f(0, 0, 0);
        }

        /*
        Angular attenuation.

        Unlike distance gain, the math for this is not specified by the OpenAL spec so we'll just go ahead and figure
        this out for ourselves at the expense of possibly being inconsistent with other implementations.

        To do cone attenuation, I'm just using the same math that we'd use to implement a basic spotlight in OpenGL. We
        just need to get the direction from the source to the listener and then do a dot product against that and the
        direction of the spotlight. Then we just compare that dot product against the cosine of the inner and outer
        angles. If the dot product is greater than the the outer angle, we just use coneOuterGain. If it's less than
        the inner angle, we just use a gain of 1. Otherwise we linearly interpolate between 1 and coneOuterGain.
        */
        if (distance > 0) {
            /* Source anglular gain. */
            float spatializerConeInnerAngle;
            float spatializerConeOuterAngle;
            float spatializerConeOuterGain;
            ma_spatializer_get_cone(pSpatializer, &spatializerConeInnerAngle, &spatializerConeOuterAngle, &spatializerConeOuterGain);

            gain *= ma_calculate_angular_gain(relativeDir, ma_vec3f_neg(relativePosNormalized), spatializerConeInnerAngle, spatializerConeOuterAngle, spatializerConeOuterGain);

            /*
            We're supporting angular gain on the listener as well for those who want to reduce the volume of sounds that
            are positioned behind the listener. On default settings, this will have no effect.
            */
            if (pListener != NULL && pListener->config.coneInnerAngleInRadians < 6.283185f) {
                ma_vec3f listenerDirection;
                float listenerInnerAngle;
                float listenerOuterAngle;
                float listenerOuterGain;

                if (pListener->config.handedness == ma_handedness_right) {
                    listenerDirection = ma_vec3f_init_3f(0, 0, -1);
                } else {
                    listenerDirection = ma_vec3f_init_3f(0, 0, +1);
                }

                listenerInnerAngle = pListener->config.coneInnerAngleInRadians;
                listenerOuterAngle = pListener->config.coneOuterAngleInRadians;
                listenerOuterGain  = pListener->config.coneOuterGain;

                gain *= ma_calculate_angular_gain(listenerDirection, relativePosNormalized, listenerInnerAngle, listenerOuterAngle, listenerOuterGain);
            }
        } else {
            /* The sound is right on top of the listener. Don't do any angular attenuation. */
        }


        /* Clamp the gain. */
        gain = ma_clamp(gain, ma_spatializer_get_min_gain(pSpatializer), ma_spatializer_get_max_gain(pSpatializer));

        /*
        Panning. This is where we'll apply the gain and convert to the output channel count. We have an optimized path for
        when we're converting to a mono stream. In that case we don't really need to do any panning - we just apply the
        gain to the final output.
        */
        /*printf("distance=%f; gain=%f\n", distance, gain);*/

        /* We must have a valid channel map here to ensure we spatialize properly. */
        MA_ASSERT(pChannelMapOut != NULL);

        /*
        We're not converting to mono so we'll want to apply some panning. This is where the feeling of something being
        to the left, right, infront or behind the listener is calculated. I'm just using a basic model here. Note that
        the code below is not based on any specific algorithm. I'm just implementing this off the top of my head and
        seeing how it goes. There might be better ways to do this.

        To determine the direction of the sound relative to a speaker I'm using dot products. Each speaker is given a
        direction. For example, the left channel in a stereo system will be -1 on the X axis and the right channel will
        be +1 on the X axis. A dot product is performed against the direction vector of the channel and the normalized
        position of the sound.
        */
        for (iChannel = 0; iChannel < channelsOut; iChannel += 1) {
            pSpatializer->pNewChannelGainsOut[iChannel] = gain;
        }

        /*
        Convert to our output channel count. If the listener is disabled we just output silence here. We cannot ignore
        the whole section of code here because we need to update some internal spatialization state.
        */
        if (ma_spatializer_listener_is_enabled(pListener)) {
            ma_channel_map_apply_f32((float*)pFramesOut, pChannelMapOut, channelsOut, (const float*)pFramesIn, pChannelMapIn, channelsIn, frameCount, ma_channel_mix_mode_rectangular, ma_mono_expansion_mode_default);
        } else {
            ma_silence_pcm_frames(pFramesOut, frameCount, ma_format_f32, pSpatializer->channelsOut);
        }

        /*
        Calculate our per-channel gains. We do this based on the normalized relative position of the sound and it's
        relation to the direction of the channel.
        */
        if (distance > 0) {
            ma_vec3f unitPos = relativePos;
            float distanceInv = 1/distance;
            unitPos.x *= distanceInv;
            unitPos.y *= distanceInv;
            unitPos.z *= distanceInv;

            for (iChannel = 0; iChannel < channelsOut; iChannel += 1) {
                ma_channel channelOut;
                float d;
                float dMin;

                channelOut = ma_channel_map_get_channel(pChannelMapOut, channelsOut, iChannel);
                if (ma_is_spatial_channel_position(channelOut)) {
                    d = ma_mix_f32_fast(1, ma_vec3f_dot(unitPos, ma_get_channel_direction(channelOut)), ma_spatializer_get_directional_attenuation_factor(pSpatializer));
                } else {
                    d = 1;  /* It's not a spatial channel so there's no real notion of direction. */
                }

                /*
                In my testing, if the panning effect is too aggressive it makes spatialization feel uncomfortable.
                The "dMin" variable below is used to control the aggressiveness of the panning effect. When set to
                0, panning will be most extreme and any sounds that are positioned on the opposite side of the
                speaker will be completely silent from that speaker. Not only does this feel uncomfortable, it
                doesn't even remotely represent the real world at all because sounds that come from your right side
                are still clearly audible from your left side. Setting "dMin" to 1 will  result in no panning at
                all, which is also not ideal. By setting it to something greater than 0, the spatialization effect
                becomes much less dramatic and a lot more bearable.

                Summary: 0 = more extreme panning; 1 = no panning.
                */
                dMin = 0.2f;  /* TODO: Consider making this configurable. */

                /*
                At this point, "d" will be positive if the sound is on the same side as the channel and negative if
                it's on the opposite side. It will be in the range of -1..1. There's two ways I can think of to
                calculate a panning value. The first is to simply convert it to 0..1, however this has a problem
                which I'm not entirely happy with. Considering a stereo system, when a sound is positioned right
                in front of the listener it'll result in each speaker getting a gain of 0.5. I don't know if I like
                the idea of having a scaling factor of 0.5 being applied to a sound when it's sitting right in front
                of the listener. I would intuitively expect that to be played at full volume, or close to it.

                The second idea I think of is to only apply a reduction in gain when the sound is on the opposite
                side of the speaker. That is, reduce the gain only when the dot product is negative. The problem
                with this is that there will not be any attenuation as the sound sweeps around the 180 degrees
                where the dot product is positive. The idea with this option is that you leave the gain at 1 when
                the sound is being played on the same side as the speaker and then you just reduce the volume when
                the sound is on the other side.

                The summarize, I think the first option should give a better sense of spatialization, but the second
                option is better for preserving the sound's power.

                UPDATE: In my testing, I find the first option to sound better. You can feel the sense of space a
                bit better, but you can also hear the reduction in volume when it's right in front.
                */
                #if 1
                {
                    /*
                    Scale the dot product from -1..1 to 0..1. Will result in a sound directly in front losing power
                    by being played at 0.5 gain.
                    */
                    d = (d + 1) * 0.5f;  /* -1..1 to 0..1 */
                    d = ma_max(d, dMin);
                    pSpatializer->pNewChannelGainsOut[iChannel] *= d;
                }
                #else
                {
                    /*
                    Only reduce the volume of the sound if it's on the opposite side. This path keeps the volume more
                    consistent, but comes at the expense of a worse sense of space and positioning.
                    */
                    if (d < 0) {
                        d += 1; /* Move into the positive range. */
                        d = ma_max(d, dMin);
                        channelGainsOut[iChannel] *= d;
                    }
                }
                #endif
            }
        } else {
            /* Assume the sound is right on top of us. Don't do any panning. */
        }

        /* Now we need to apply the volume to each channel. This needs to run through the gainer to ensure we get a smooth volume transition. */
        ma_gainer_set_gains(&pSpatializer->gainer, pSpatializer->pNewChannelGainsOut);
        ma_gainer_process_pcm_frames(&pSpatializer->gainer, pFramesOut, pFramesOut, frameCount);

        /*
        Before leaving we'll want to update our doppler pitch so that the caller can apply some
        pitch shifting if they desire. Note that we need to negate the relative position here
        because the doppler calculation needs to be source-to-listener, but ours is listener-to-
        source.
        */
        if (dopplerFactor > 0) {
            pSpatializer->dopplerPitch = ma_doppler_pitch(ma_vec3f_sub(pListener->position, pSpatializer->position), pSpatializer->velocity, listenerVel, speedOfSound, dopplerFactor);
        } else {
            pSpatializer->dopplerPitch = 1;
        }
    }

    return MA_SUCCESS;
}